

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<std::pair<Kernel::Term_*,_bool>_>::expand(Stack<std::pair<Kernel::Term_*,_bool>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pair<Kernel::Term_*,_bool> *ppVar3;
  undefined8 uVar4;
  pair<Kernel::Term_*,_bool> *ppVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  
  sVar8 = 8;
  if (this->_capacity != 0) {
    sVar8 = this->_capacity * 2;
  }
  uVar9 = sVar8 * 0x10;
  if (uVar9 == 0) {
    ppVar5 = (pair<Kernel::Term_*,_bool> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar9 < 0x21) {
    ppVar5 = (pair<Kernel::Term_*,_bool> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar9 < 0x31) {
    ppVar5 = (pair<Kernel::Term_*,_bool> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar9 < 0x41) {
    ppVar5 = (pair<Kernel::Term_*,_bool> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ppVar5 = (pair<Kernel::Term_*,_bool> *)::operator_new(uVar9,0x10);
  }
  if (this->_capacity != 0) {
    uVar9 = this->_capacity;
    if (uVar9 != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&this->_stack->first + lVar6);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&ppVar5->first + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        uVar7 = uVar7 + 1;
        uVar9 = this->_capacity;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < uVar9);
    }
    ppVar3 = this->_stack;
    if (ppVar3 != (pair<Kernel::Term_*,_bool> *)0x0) {
      uVar9 = uVar9 * 0x10;
      if (uVar9 == 0) {
        ppVar3->first = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppVar3;
      }
      else if (uVar9 < 0x11) {
        ppVar3->first = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppVar3;
      }
      else if (uVar9 < 0x19) {
        ppVar3->first = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppVar3;
      }
      else if (uVar9 < 0x21) {
        ppVar3->first = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppVar3;
      }
      else if (uVar9 < 0x31) {
        ppVar3->first = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppVar3;
      }
      else if (uVar9 < 0x41) {
        ppVar3->first = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppVar3;
      }
      else {
        operator_delete(ppVar3,0x10);
      }
    }
  }
  this->_stack = ppVar5;
  this->_cursor = ppVar5 + this->_capacity;
  this->_end = ppVar5 + sVar8;
  this->_capacity = sVar8;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }